

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O0

char16 __thiscall
UnifiedRegex::CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::ToCanonical
          (CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_> *this,char16 c)

{
  unsigned_long uVar1;
  char16 local_2a;
  uint64 r;
  char16 c_local;
  CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_> *this_local;
  
  uVar1 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Get(&this->toEquivs,c);
  if (uVar1 == 0xffffffffffffffff) {
    local_2a = CaseMapper<UnifiedRegex::TrivialCaseMapper>::ToCanonical(this->fallbackMapper,c);
  }
  else {
    local_2a = Chars<char16_t>::UTC((uint)uVar1 & 0xffff);
  }
  return local_2a;
}

Assistant:

inline char16 ToCanonical(char16 c) const
        {
            uint64 r = toEquivs.Get(c);
            return r == EQUIV_MISSING ? fallbackMapper->ToCanonical(c) : Chars<char16>::UTC(r & 0xffff);
        }